

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpsctl.c
# Opt level: O0

slReturn actionSaveConfig(optionDef_slOptions *defs,psloConfig *config)

{
  errInfo error;
  errInfo error_00;
  _Bool _Var1;
  errorInfo_slReturn local_78;
  slReturn local_58;
  slReturn uscResp;
  char *local_48;
  char *local_40;
  uint32_t local_38;
  undefined4 uStack_34;
  slReturn local_30;
  slReturn usResp;
  clientData_slOptions *clientData;
  psloConfig *config_local;
  optionDef_slOptions *defs_local;
  
  usResp = config->clientData;
  clientData = (clientData_slOptions *)config;
  config_local = (psloConfig *)defs;
  local_30 = syncSerial(syncUBX,(clientData_slOptions *)usResp);
  _Var1 = isErrorReturn(local_30);
  if (_Var1) {
    createErrorInfo((errorInfo_slReturn *)&uscResp,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/gpsctl.c"
                    ,"actionSaveConfig",0x3fa,local_30);
    error.fileName = local_48;
    error.cause = uscResp;
    error.functionName = local_40;
    error.lineNumber = local_38;
    error._28_4_ = uStack_34;
    defs_local = (optionDef_slOptions *)
                 makeErrorMsgReturn(error,"could not synchronize UBX protocol");
  }
  else {
    local_58 = ubxSaveConfig(*(int *)(clientData->port + 0x34),*(int *)clientData->port);
    _Var1 = isErrorReturn(local_58);
    if (_Var1) {
      createErrorInfo(&local_78,
                      "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/gpsctl.c"
                      ,"actionSaveConfig",0x3ff,local_58);
      error_00.fileName = local_78.fileName;
      error_00.cause = local_78.cause;
      error_00.functionName = local_78.functionName;
      error_00.lineNumber = local_78.lineNumber;
      error_00._28_4_ = local_78._28_4_;
      defs_local = (optionDef_slOptions *)
                   makeErrorMsgReturn(error_00,"problem saving GPS configuration");
    }
    else {
      defs_local = (optionDef_slOptions *)makeOkReturn();
    }
  }
  return defs_local;
}

Assistant:

static slReturn  actionSaveConfig(const optionDef_slOptions* defs, const psloConfig* config) {

    // make sure we're synchronized...
    clientData_slOptions* clientData = config->clientData;
    slReturn usResp = syncSerial(syncUBX, clientData);
    if (isErrorReturn(usResp))
        return makeErrorMsgReturn(ERR_CAUSE(usResp), "could not synchronize UBX protocol");

    // save the GPS configuration...
    slReturn uscResp = ubxSaveConfig(config->clientData->fdPort, config->clientData->verbosity);
    if (isErrorReturn(uscResp))
        return makeErrorMsgReturn(ERR_CAUSE(uscResp), "problem saving GPS configuration");

    return makeOkReturn();
}